

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void init_all_wedge_masks(void)

{
  byte bVar1;
  byte bVar2;
  wedge_masks_type *papuVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint uVar7;
  int iVar8;
  size_t __n;
  uint8_t (*pauVar9) [4096];
  uint8_t uVar10;
  uint8_t uVar11;
  size_t __n_00;
  long lVar12;
  ulong uVar13;
  void *__dest;
  uint8_t (*pauVar14) [4096];
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint uVar18;
  uint8_t (*paauVar19) [6] [4096];
  int *piVar20;
  size_t sVar21;
  size_t __n_01;
  long lVar22;
  uint8_t (*__s) [1024];
  int bh;
  int bw;
  char local_80;
  uint local_60;
  
  __n_00 = 0x50;
  __n_01 = 0x30;
  lVar22 = 0x308f;
  uVar4 = 0xfffffffffffffffe;
  lVar12 = 0x3040;
  paauVar19 = wedge_mask_obl;
  do {
    sVar21 = __n_00 - 0x40;
    __dest = (void *)((long)wedge_masks[0x15][1] + lVar12 + 0x50);
    if ((long)sVar21 < 0) {
      __n = __n_01 - 0x40;
      memcpy(__dest,"" + __n_01,__n_00);
      __dest = (void *)((long)wedge_masks[0x15][1] + lVar22 + 0x51);
      iVar8 = 0x40;
    }
    else {
      memcpy((void *)((long)wedge_masks[0x15][1] + lVar22 + 0x11),"",__n_01);
      iVar8 = 0;
      __n = sVar21;
    }
    memset(__dest,iVar8,__n);
    puVar5 = wedge_mask_obl[0][0] + lVar12;
    if ((long)sVar21 < 1) {
      sVar21 = __n_01 - 0x3f;
      memcpy(puVar5,"" + __n_01 + 1,__n_00 - 1);
      puVar5 = wedge_mask_obl[0][0] + lVar22;
      iVar8 = 0x40;
    }
    else {
      sVar21 = __n_00 - 0x41;
      memcpy((void *)((long)wedge_masks[0x15][1] + lVar22 + 0x50),"",__n_01 + 1);
      iVar8 = 0;
    }
    memset(puVar5,iVar8,sVar21);
    builtin_memcpy((uint8_t *)((long)&aom_quantize_b_32x32 + lVar12),"@@@@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_quantize_b_64x64 + lVar12),"@@@@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_paeth_predictor_8x8 + lVar12),"+9>@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_quantize_b + lVar12),"@@@@@@@@",8);
    puVar5 = (uint8_t *)((long)&aom_paeth_predictor_8x32 + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_paeth_predictor_8x4 + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\x02';
    puVar5[6] = '\a';
    puVar5[7] = '\x15';
    puVar5 = (uint8_t *)((long)&aom_paeth_predictor_64x64 + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_paeth_predictor_8x16 + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_quantize_b_adaptive + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_sad128x128 + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_sad128x128_avg + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    puVar5 = (uint8_t *)((long)&aom_sad128x128x3d + lVar12);
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\x02';
    puVar5[6] = '\a';
    puVar5[7] = '\x15';
    builtin_memcpy((uint8_t *)((long)&aom_sad128x128x4d + lVar12),"+9>@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_sad128x64 + lVar12),"@@@@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_sad128x64_avg + lVar12),"@@@@@@@@",8);
    builtin_memcpy((uint8_t *)((long)&aom_sad128x64x3d + lVar12),"@@@@@@@@",8);
    __n_00 = __n_00 - 1;
    __n_01 = __n_01 + 1;
    lVar22 = lVar22 + 0x7f;
    uVar4 = uVar4 + 2;
    lVar12 = lVar12 + 0x80;
  } while (uVar4 < 0x3e);
  puVar5 = wedge_mask_obl[0][4] + 0x3f;
  puVar6 = wedge_mask_obl[0][5] + 0xfc0;
  pauVar9 = wedge_mask_obl[1] + 3;
  lVar12 = 0;
  do {
    lVar22 = 0;
    pauVar14 = pauVar9;
    puVar16 = puVar6;
    puVar17 = puVar5;
    do {
      uVar11 = pauVar14[-6][0];
      *(uint8_t *)((long)paauVar19 + lVar22 + 0x2000) = uVar11;
      uVar10 = '@' - uVar11;
      *puVar16 = uVar10;
      *puVar17 = uVar10;
      *(uint8_t *)((long)paauVar19 + lVar22 + 0x8000) = uVar10;
      (*pauVar14)[0] = uVar10;
      puVar16[0x6000] = uVar11;
      puVar17[0x6000] = uVar11;
      uVar11 = pauVar14[-8][0];
      *(uint8_t *)((long)paauVar19 + lVar22) = uVar11;
      uVar11 = '@' - uVar11;
      *(uint8_t *)((long)paauVar19 + lVar22 + 0x6000) = uVar11;
      pauVar14[-2][0] = uVar11;
      lVar22 = lVar22 + 0x40;
      puVar17 = puVar17 + -1;
      puVar16 = puVar16 + -0x40;
      pauVar14 = (uint8_t (*) [4096])(*pauVar14 + 1);
    } while (lVar22 != 0x1000);
    lVar12 = lVar12 + 1;
    puVar5 = puVar5 + 0x40;
    puVar6 = puVar6 + 1;
    paauVar19 = (uint8_t (*) [6] [4096])((long)paauVar19 + 1);
    pauVar9 = (uint8_t (*) [4096])(*pauVar9 + 0x40);
  } while (lVar12 != 0x40);
  lVar12 = 0;
  memset(wedge_masks,0,0x1600);
  puVar5 = wedge_mask_buf;
  do {
    uVar18 = av1_wedge_params_lookup[lVar12].wedge_types;
    if (((ulong)uVar18 != 0) && (0 < (int)uVar18)) {
      bVar1 = block_size_wide[lVar12];
      bVar2 = block_size_high[lVar12];
      puVar6 = av1_wedge_params_lookup[lVar12].signflip;
      uVar7 = (uint)bVar1;
      piVar20 = &(av1_wedge_params_lookup[lVar12].codebook)->y_offset;
      uVar4 = 0;
      do {
        (*aom_convolve_copy)
                  ((uint8_t *)
                   ((long)-((int)(piVar20[-1] * uVar7) >> 3) +
                    (long)(int)(0x800 - (*piVar20 * (uint)bVar2 * 8 & 0xffffffc0)) +
                    (ulong)((wedge_code_type *)(piVar20 + -2))->direction * 0x1000 +
                    (ulong)((uint)puVar6[uVar4] * 0x6000) + 0x5e3d40),0x40,puVar5,(ulong)bVar1,uVar7
                   ,(int)bVar2);
        papuVar3 = av1_wedge_params_lookup[lVar12].masks;
        (*papuVar3)[uVar4] = puVar5;
        puVar5 = puVar5 + (uint)bVar2 * (uint)bVar1;
        (*aom_convolve_copy)
                  ((uint8_t *)
                   ((long)-((int)(piVar20[-1] * uVar7) >> 3) +
                    (long)(int)(0x800 - (*piVar20 * (uint)bVar2 * 8 & 0xffffffc0)) +
                    (ulong)((wedge_code_type *)(piVar20 + -2))->direction * 0x1000 +
                    (ulong)((puVar6[uVar4] ^ 1) * 0x6000) + 0x5e3d40),0x40,puVar5,(ulong)bVar1,uVar7
                   ,(int)bVar2);
        papuVar3[1][uVar4] = puVar5;
        puVar5 = puVar5 + (uint)bVar2 * (uint)bVar1;
        uVar4 = uVar4 + 1;
        piVar20 = piVar20 + 3;
      } while (uVar18 != uVar4);
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x16);
  lVar12 = 0;
  do {
    local_60 = (uint)lVar12 & 0xff;
    lVar22 = 0;
    do {
      if ((((uint)(0x10f400L >> ((byte)lVar22 & 0x3f)) | (uint)(0x20f800L >> ((byte)lVar22 & 0x3f)))
          & 1) == 0) {
        bVar1 = block_size_wide[lVar22];
        uVar4 = (ulong)bVar1;
        __s = smooth_interintra_mask_buf[lVar12] + lVar22;
        bVar2 = " \x10\x10\x10\b\b\b\x04\x04\x04\x02\x02\x02\x01\x01\x01\b\b\x04\x04\x02\x02"
                [lVar22];
        local_80 = (char)lVar12;
        uVar18 = (uint)block_size_high[lVar22];
        if (local_80 == '\x01') {
          uVar13 = (ulong)(uVar18 + (uVar18 == 0));
          puVar5 = 
          "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          ;
          do {
            memset(__s,(uint)*puVar5,uVar4);
            __s = (uint8_t (*) [1024])(*__s + uVar4);
            puVar5 = puVar5 + bVar2;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        else if (local_60 == 2) {
          iVar8 = 0;
          do {
            puVar5 = 
            "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            ;
            uVar13 = 0;
            do {
              (*__s)[uVar13] = *puVar5;
              uVar13 = uVar13 + 1;
              puVar5 = puVar5 + bVar2;
            } while ((uint)bVar1 + (uint)(bVar1 == 0) != uVar13);
            __s = (uint8_t (*) [1024])(*__s + uVar4);
            iVar8 = iVar8 + 1;
          } while (iVar8 != uVar18 + (uVar18 == 0));
        }
        else if (local_60 == 3) {
          uVar7 = 0;
          do {
            uVar13 = 0;
            do {
              uVar15 = uVar13 & 0xffffffff;
              if (uVar7 < (uint)uVar13) {
                uVar15 = (ulong)uVar7;
              }
              (*__s)[uVar13] =
                   "<:86420/-,*)\'&%#\"! \x1f\x1e\x1d\x1c\x1b\x1a\x19\x18\x17\x16\x16\x15\x14\x13\x13\x12\x12\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\f\v\v\n\n\n\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                   [uVar15 * bVar2];
              uVar13 = uVar13 + 1;
            } while ((uint)bVar1 + (uint)(bVar1 == 0) != uVar13);
            __s = (uint8_t (*) [1024])(*__s + uVar4);
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar18 + (uVar18 == 0));
        }
        else {
          memset(smooth_interintra_mask_buf[lVar12] + lVar22,0x20,
                 (uVar18 + (block_size_high[lVar22] == 0) & 0xff) * uVar4);
        }
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 0x16);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  return;
}

Assistant:

static void init_all_wedge_masks(void) {
  init_wedge_master_masks();
  init_wedge_masks();
  init_smooth_interintra_masks();
}